

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTexture.cpp
# Opt level: O3

uint32_t __thiscall
GmmLib::GmmTextureCalc::ExpandWidth
          (GmmTextureCalc *this,uint32_t Width,uint32_t UnitAlignment,uint32_t NumSamples)

{
  uint uVar1;
  
  uVar1 = NumSamples - 2 >> 1 | (uint)((NumSamples - 2 & 1) != 0) << 0x1f;
  if (uVar1 < 2) {
    Width = (Width + (Width == 0)) * 2 + 2 & 0xfffffffc;
  }
  else if ((uVar1 == 3) || (uVar1 == 7)) {
    Width = (Width + (Width == 0)) * 4 + 4 & 0xfffffff8;
  }
  if (Width <= UnitAlignment) {
    Width = UnitAlignment;
  }
  if (UnitAlignment != 0) {
    uVar1 = (UnitAlignment - 1) + Width;
    Width = uVar1 - uVar1 % UnitAlignment;
  }
  return Width;
}

Assistant:

uint32_t GmmLib::GmmTextureCalc::ExpandWidth(uint32_t Width, uint32_t UnitAlignment, uint32_t NumSamples)
{
    uint32_t ExpandedWidth;

    switch(NumSamples)
    {
        case 1:
            ExpandedWidth = Width;
            break;
        case 2: // Same as 4x...
        case 4:
            ExpandedWidth = GFX_CEIL_DIV(GFX_MAX(Width, 1), 2) * 4;
            break;
        case 8: // Same as 16x...
        case 16:
            ExpandedWidth = GFX_CEIL_DIV(GFX_MAX(Width, 1), 2) * 8;
            break;
        default:
            ExpandedWidth = Width;
            __GMM_ASSERT(0);
    }

    ExpandedWidth = GFX_MAX(ExpandedWidth, UnitAlignment);
    ExpandedWidth = GFX_ALIGN_NP2(ExpandedWidth, UnitAlignment);

    return (ExpandedWidth);
}